

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.cpp
# Opt level: O2

BitMatrix *
ZXing::Deflate(BitMatrix *__return_storage_ptr__,BitMatrix *input,int width,int height,float top,
              float left,float subSampling)

{
  bool bVar1;
  int y;
  int y_00;
  int x;
  int x_00;
  PointF p;
  
  BitMatrix::BitMatrix(__return_storage_ptr__,width,height);
  for (y_00 = 0; y_00 < __return_storage_ptr__->_height; y_00 = y_00 + 1) {
    for (x_00 = 0; x_00 < __return_storage_ptr__->_width; x_00 = x_00 + 1) {
      p.x = (double)((float)x_00 * subSampling + left);
      p.y = (double)((float)y_00 * subSampling + top);
      bVar1 = BitMatrix::get(input,p);
      if (bVar1) {
        BitMatrix::set(__return_storage_ptr__,x_00,y_00,true);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BitMatrix Deflate(const BitMatrix& input, int width, int height, float top, float left, float subSampling)
{
	BitMatrix result(width, height);

	for (int y = 0; y < result.height(); y++) {
		auto yOffset = top + y * subSampling;
		for (int x = 0; x < result.width(); x++) {
			if (input.get(PointF(left + x * subSampling, yOffset)))
				result.set(x, y);
		}
	}

	return result;
}